

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::become_leader(raft_server *this)

{
  element_type *peVar1;
  __int_type _Var2;
  element_type *peVar3;
  element_type *peVar4;
  __weak_count<(__gnu_cxx::_Lock_policy)2> __mutex;
  int iVar5;
  int iVar6;
  int32 iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  buffer *pbVar8;
  size_t sVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  __node_base *p_Var10;
  __int_type _Var11;
  undefined1 local_d1;
  ptr<peer> pp;
  ptr<cluster_config> last_config_cloned;
  ulong my_term;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_90;
  ptr<log_entry> entry;
  ptr<buffer> conf_buf;
  ptr<raft_params> params;
  Param param;
  
  stop_election_timer(this);
  std::mutex::lock(&this->commit_ret_elems_lock_);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar5 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar5) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&pp,"number of pending commit elements: %zu",
                 (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x3dd,&pp);
      std::__cxx11::string::~string((string *)&pp);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
  context::get_params((context *)&params);
  std::mutex::lock(&this->cli_lock_);
  LOCK();
  (this->role_)._M_i = leader;
  UNLOCK();
  LOCK();
  (this->leader_).super___atomic_base<int>._M_i = this->id_;
  UNLOCK();
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
  timer_helper::set_duration_ms
            (&this->leadership_transfer_timer_,
             (long)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->leadership_transfer_min_wait_time_);
  timer_helper::reset(&this->leadership_transfer_timer_);
  iVar5 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  LOCK();
  (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
       CONCAT44(extraout_var,iVar5) - 1;
  UNLOCK();
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar5 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar5) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var11 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      _Var2 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)&pp,
                 "state machine commit index %lu, precommit index %lu, last log index %lu",_Var11,
                 _Var2,CONCAT44(extraout_var_00,iVar5) + -1);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x3ed,&pp);
      std::__cxx11::string::~string((string *)&pp);
    }
  }
  param.myId = 0;
  param.leaderId = 0;
  param.peerId = 0;
  param._12_4_ = 0;
  p_Var10 = &(this->peers_)._M_h._M_before_begin;
  while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 2));
    clear_snapshot_sync_ctx
              (this,pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    peVar4 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar5 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    LOCK();
    (peVar4->next_log_idx_).super___atomic_base<unsigned_long>._M_i =
         CONCAT44(extraout_var_01,iVar5);
    UNLOCK();
    enable_hb_for_peer(this,pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->cli_lock_;
  get_config((raft_server *)&my_term);
  _Var11 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
  iVar5 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  while (_Var11 = _Var11 + 1, _Var11 < CONCAT44(extraout_var_02,iVar5)) {
    peVar3 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar3->_vptr_log_store[10])(&last_config_cloned,peVar3,_Var11);
    if ((char)(last_config_cloned.
               super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              prev_log_idx_ == '\x02') {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar6 = (*peVar1->_vptr_logger[7])(peVar1);
        if (3 < iVar6) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pbVar8 = log_entry::get_buf((log_entry *)
                                      last_config_cloned.
                                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
          sVar9 = buffer::size(pbVar8);
          msg_if_given_abi_cxx11_
                    ((string *)&pp,"found uncommitted config at %lu, size %zu",_Var11,sVar9);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"become_leader",0x405,(cluster_config *)&pp);
          std::__cxx11::string::~string((string *)&pp);
        }
      }
      pbVar8 = log_entry::get_buf((log_entry *)
                                  last_config_cloned.
                                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      cluster_config::deserialize((cluster_config *)&pp,pbVar8);
      std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)&my_term,
                 (__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)&pp);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&last_config_cloned.
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  cluster_config::serialize((cluster_config *)&pp);
  __mutex._M_pi = local_90._M_pi;
  cluster_config::deserialize
            ((cluster_config *)&last_config_cloned,
             (buffer *)pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  iVar5 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  (last_config_cloned.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->prev_log_idx_ =
       (last_config_cloned.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->log_idx_;
  (last_config_cloned.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->log_idx_ = CONCAT44(extraout_var_03,iVar5);
  cluster_config::serialize((cluster_config *)&conf_buf);
  pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  local_d1 = 2;
  timer_helper::get_timeofday_us();
  std::
  make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
            ((unsigned_long *)&entry,(shared_ptr<nuraft::buffer> *)&pp,(log_val_type *)&conf_buf,
             (unsigned_long *)&local_d1);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar5 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar5) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)&pp,"[BECOME LEADER] appended new config at %lu",
                 CONCAT44(extraout_var_04,iVar5));
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x414,&pp);
      std::__cxx11::string::~string((string *)&pp);
    }
  }
  store_log_entry(this,&entry,0);
  this->config_changing_ = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&last_config_cloned.
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param.peerId);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex._M_pi);
  param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
  param.myId = this->id_;
  param.peerId = -1;
  my_term = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
  param.ctx = &my_term;
  cb_func::call(&((this->ctx_)._M_t.
                  super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t
                  .super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                  super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                BecomeLeader,&param);
  LOCK();
  (this->write_paused_)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->initialized_)._M_base._M_i = true;
  UNLOCK();
  LOCK();
  (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->data_fresh_)._M_base._M_i = true;
  UNLOCK();
  request_append_entries(this);
  if (this->my_priority_ == 0) {
    iVar7 = get_num_voting_members(this);
    if (1 < iVar7) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar5 = (*peVar1->_vptr_logger[7])();
        if (3 < iVar5) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&pp,"[BECOME LEADER] my priority is 0, will resign shortly");
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"become_leader",0x42b,&pp);
          std::__cxx11::string::~string((string *)&pp);
        }
      }
      yield_leadership(this,false,-1);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::become_leader() {
    stop_election_timer();

    {   auto_lock(commit_ret_elems_lock_);
        p_in("number of pending commit elements: %zu",
             commit_ret_elems_.size());
    }

    ptr<raft_params> params = ctx_->get_params();
    {   auto_lock(cli_lock_);
        role_ = srv_role::leader;
        leader_ = id_;
        srv_to_join_.reset();
        leadership_transfer_timer_.set_duration_ms
            (params->leadership_transfer_min_wait_time_);
        leadership_transfer_timer_.reset();
        precommit_index_ = log_store_->next_slot() - 1;
        p_in("state machine commit index %" PRIu64 ", "
             "precommit index %" PRIu64 ", last log index %" PRIu64,
             sm_commit_index_.load(),
             precommit_index_.load(),
             log_store_->next_slot() - 1);
        ptr<snapshot> nil_snp;
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            ptr<peer> pp = it->second;
            clear_snapshot_sync_ctx(*pp);
            // Reset RPC client for all peers.
            // NOTE: Now we don't reset client, as we already did it
            //       during pre-vote phase.
            // reconnect_client(*pp);

            pp->set_next_log_idx(log_store_->next_slot());
            enable_hb_for_peer(*pp);
        }

        // If there are uncommitted logs, search if conf log exists.
        ptr<cluster_config> last_config = get_config();

        ulong s_idx = sm_commit_index_ + 1;
        ulong e_idx = log_store_->next_slot();
        for (ulong ii = s_idx; ii < e_idx; ++ii) {
            ptr<log_entry> le = log_store_->entry_at(ii);
            if (le->get_val_type() != log_val_type::conf) continue;

            p_in("found uncommitted config at %" PRIu64 ", size %zu",
                 ii, le->get_buf().size());
            last_config = cluster_config::deserialize(le->get_buf());
        }

        // WARNING: WE SHOULD NOT CHANGE THE ORIGINAL CONTENTS DIRECTLY!
        ptr<cluster_config> last_config_cloned =
            cluster_config::deserialize( *last_config->serialize() );
        last_config_cloned->set_log_idx(log_store_->next_slot());
        ptr<buffer> conf_buf = last_config_cloned->serialize();
        ptr<log_entry> entry
            ( cs_new<log_entry>
              ( state_->get_term(),
                conf_buf,
                log_val_type::conf,
                timer_helper::get_timeofday_us() ) );
        p_in("[BECOME LEADER] appended new config at %" PRIu64, log_store_->next_slot());
        store_log_entry(entry);
        config_changing_ = true;
    }

    cb_func::Param param(id_, leader_);
    ulong my_term = state_->get_term();
    param.ctx = &my_term;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::BecomeLeader, &param);
    (void)rc; // nothing to do in this callback.

    write_paused_ = false;
    next_leader_candidate_ = -1;
    initialized_ = true;
    pre_vote_.quorum_reject_count_ = 0;
    pre_vote_.failure_count_ = 0;
    data_fresh_ = true;

    request_append_entries();

    if (my_priority_ == 0 && get_num_voting_members() > 1) {
        // If this member's priority is zero, this node owns a temporary
        // leadership. Let other node takeover shortly.
        p_in("[BECOME LEADER] my priority is 0, will resign shortly");
        yield_leadership();
    }
}